

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsNumber.c
# Opt level: O0

void JsNumberInit(JsVm *vm)

{
  JsObject *number_00;
  JsObject *number_proto_00;
  JsValue *pJVar1;
  JsValue *v;
  JsObject *number_proto;
  JsObject *number;
  JsVm *vm_local;
  
  number_00 = JsCreateStandardFunctionObject((JsObject *)0x0,(JsList)0x0,1);
  number_proto_00 = JsCreateNumberObject((JsObject *)0x0,0.0);
  JsNumberFunctionInit(number_00,number_proto_00);
  JsNumberProtoInit(number_00,number_proto_00);
  pJVar1 = (JsValue *)JsMalloc(0x18);
  pJVar1->type = JS_OBJECT;
  (pJVar1->u).object = number_00;
  (*vm->Global->Put)(vm->Global,"Number",pJVar1,7);
  return;
}

Assistant:

void JsNumberInit(struct JsVm* vm){
	
	struct JsObject* number = JsCreateStandardFunctionObject(NULL,NULL,TRUE);
	struct JsObject* number_proto = JsCreateNumberObject(NULL,0);
	
	JsNumberFunctionInit(number,number_proto);
	JsNumberProtoInit(number,number_proto);
	struct JsValue* v = (struct JsValue*)JsMalloc(sizeof(struct JsValue));
	v->type = JS_OBJECT;
	v->u.object = number;
	(*vm->Global->Put)(vm->Global,"Number",v,JS_OBJECT_ATTR_STRICT);
}